

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-prefs.c
# Opt level: O2

_Bool process_pref_file_layered
                (char *name,_Bool quiet,_Bool user,char *base_search_path,char *fallback_search_path
                ,_Bool *used_fallback)

{
  _Bool _Var1;
  char buf [1024];
  char acStack_428 [1024];
  
  if (base_search_path != (char *)0x0) {
    path_build(acStack_428,0x400,base_search_path,name);
    if (used_fallback != (_Bool *)0x0) {
      *used_fallback = false;
    }
    _Var1 = file_exists(acStack_428);
    if (fallback_search_path != (char *)0x0 && !_Var1) {
      path_build(acStack_428,0x400,fallback_search_path,name);
      if (used_fallback != (_Bool *)0x0) {
        *used_fallback = true;
      }
    }
    _Var1 = process_pref_file_named(acStack_428,quiet,user);
    return _Var1;
  }
  __assert_fail("base_search_path != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-prefs.c"
                ,0x4f1,
                "_Bool process_pref_file_layered(const char *, _Bool, _Bool, const char *, const char *, _Bool *)"
               );
}

Assistant:

static bool process_pref_file_layered(const char *name, bool quiet, bool user,
									  const char *base_search_path,
									  const char *fallback_search_path,
									  bool *used_fallback)
{
	char buf[1024];

	assert(base_search_path != NULL);

	/* Build the filename */
	path_build(buf, sizeof(buf), base_search_path, name);

	if (used_fallback != NULL)
		*used_fallback = false;

	if (!file_exists(buf) && fallback_search_path != NULL) {
		path_build(buf, sizeof(buf), fallback_search_path, name);

		if (used_fallback != NULL)
			*used_fallback = true;
	}

	return process_pref_file_named(buf, quiet, user);
}